

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nussinov.cpp
# Opt level: O0

void __thiscall Nussinov::lambda_swipe(Nussinov *this,double incr,ostream *fout,string *outfile)

{
  int iVar1;
  ostream *poVar2;
  void *pvVar3;
  __tuple_element_t<0UL,_tuple<double,_basic_string<char>_>_> *p_Var4;
  __tuple_element_t<1UL,_tuple<double,_basic_string<char>_>_> *p_Var5;
  reference pvVar6;
  ostream *poVar7;
  string *in_RDX;
  ostream *in_RSI;
  double in_XMM0_Qa;
  double dVar8;
  NussinovAlgorithm F;
  vector<int,_std::allocator<int>_> rna_n;
  double in_stack_00000210;
  Nussinov *in_stack_00000218;
  double lambda;
  string rna;
  tuple<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  temp;
  double CAI;
  double O;
  int index;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  dataset;
  vector<double,_std::allocator<double>_> CAI_buffer;
  vector<double,_std::allocator<double>_> F_buffer;
  vector<double,_std::allocator<double>_> lambda_buffer;
  int size;
  pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *in_stack_fffffffffffffc98;
  NussinovAlgorithm *in_stack_fffffffffffffca0;
  allocator_type *in_stack_fffffffffffffca8;
  allocator_type *in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb8;
  int in_stack_fffffffffffffcbc;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffcc0;
  string *in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffcd0;
  int in_stack_fffffffffffffcd4;
  NussinovAlgorithm *in_stack_fffffffffffffcf8;
  ostream *in_stack_fffffffffffffd00;
  string local_250 [184];
  string local_198 [40];
  vector<int,_std::allocator<int>_> local_170 [2];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  *in_stack_fffffffffffffec8;
  string *psVar9;
  string *psVar10;
  string local_128 [72];
  allocator_type *local_e0;
  __tuple_element_t<0UL,_tuple<double,_basic_string<char>_>_> local_d8;
  int local_d0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  local_c8;
  undefined8 local_a8;
  vector<double,_std::allocator<double>_> local_a0;
  undefined8 local_80;
  vector<double,_std::allocator<double>_> local_78 [2];
  undefined8 local_48;
  vector<double,_std::allocator<double>_> local_40;
  int local_24;
  ostream *local_18;
  double local_10;
  
  local_18 = in_RSI;
  local_10 = in_XMM0_Qa;
  dVar8 = ceil(1.0 / in_XMM0_Qa + 1.0);
  local_24 = (int)dVar8;
  poVar2 = std::operator<<((ostream *)&std::cout,"size: ");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,local_24);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  local_48 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x13b5de);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffcc0,CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8)
             ,(value_type_conflict1 *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  std::allocator<double>::~allocator((allocator<double> *)0x13b612);
  local_80 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x13b643);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffcc0,CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8)
             ,(value_type_conflict1 *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  std::allocator<double>::~allocator((allocator<double> *)0x13b677);
  local_a8 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x13b6a8);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffcc0,CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8)
             ,(value_type_conflict1 *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  std::allocator<double>::~allocator((allocator<double> *)0x13b6dc);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>
               *)0x13b6f1);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
            *)in_stack_fffffffffffffcc0,
           CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),in_stack_fffffffffffffcb0);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>
                *)0x13b71a);
  local_d0 = 0;
  local_e0 = (allocator_type *)0x0;
  std::
  tuple<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  tuple<true,_true>((tuple<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x13b73e);
  std::__cxx11::string::string(local_128);
  psVar9 = (string *)0x0;
  while ((double)psVar9 < 1.001) {
    poVar2 = std::operator<<(local_18,"lambda: ");
    pvVar3 = (void *)std::ostream::operator<<(poVar2,(double)psVar9);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    nussinov_CAI_abi_cxx11_
              (in_stack_00000218,in_stack_00000210,
               (ostream *)
               rna_n.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage);
    std::
    tuple<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=((tuple<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffffca0,(type)in_stack_fffffffffffffc98);
    std::
    tuple<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~tuple((tuple<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x13b81c);
    p_Var4 = std::get<0ul,double,std::__cxx11::string>
                       ((tuple<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x13b829);
    local_d8 = *p_Var4;
    p_Var5 = std::get<1ul,double,std::__cxx11::string>
                       ((tuple<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)0x13b843);
    std::__cxx11::string::operator=(local_128,(string *)p_Var5);
    std::__cxx11::string::size();
    std::allocator<int>::allocator((allocator<int> *)0x13b87f);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcc0,
               CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
               (allocator_type *)in_stack_fffffffffffffcb0);
    std::allocator<int>::~allocator((allocator<int> *)0x13b8ab);
    std::__cxx11::string::string(local_198,local_128);
    transform2num((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcb0,
                  (string *)in_stack_fffffffffffffca8);
    std::__cxx11::string::~string(local_198);
    local_e0 = (allocator_type *)
               getCAI_s((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd00,
                        &in_stack_fffffffffffffcf8->rna);
    if (((double)psVar9 == 1.0) && (!NAN((double)psVar9))) {
      local_e0 = (allocator_type *)0x0;
    }
    psVar10 = psVar9;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,(long)local_d0);
    *pvVar6 = (value_type)psVar9;
    std::vector<int,_std::allocator<int>_>::size(local_170);
    NussinovAlgorithm::NussinovAlgorithm
              ((NussinovAlgorithm *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcc8,
               (int)((ulong)in_stack_fffffffffffffcc0 >> 0x20),(int)in_stack_fffffffffffffcc0);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,(double)psVar10);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_d8);
    in_stack_fffffffffffffd00 = std::operator<<(poVar2," ");
    in_stack_fffffffffffffcf8 =
         (NussinovAlgorithm *)std::ostream::operator<<(in_stack_fffffffffffffd00,(double)local_e0);
    poVar2 = std::operator<<((ostream *)in_stack_fffffffffffffcf8," ");
    std::vector<int,_std::allocator<int>_>::size(local_170);
    iVar1 = NussinovAlgorithm::nussinov
                      (in_stack_fffffffffffffcf8,(int)((ulong)poVar2 >> 0x20),(int)poVar2);
    poVar7 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    in_stack_fffffffffffffcc8 = psVar10;
    poVar7 = std::operator<<(poVar7," ");
    psVar9 = in_stack_fffffffffffffcc8;
    std::vector<int,_std::allocator<int>_>::size(local_170);
    in_stack_fffffffffffffcd4 =
         NussinovAlgorithm::nussinov
                   (in_stack_fffffffffffffcf8,(int)((ulong)poVar2 >> 0x20),(int)poVar2);
    in_stack_fffffffffffffcc0 =
         (vector<double,_std::allocator<double>_> *)
         std::ostream::operator<<
                   (poVar7,(double)in_stack_fffffffffffffcc8 * (double)in_stack_fffffffffffffcd4 +
                           (1.0 - (double)psVar9) * (double)local_e0);
    std::ostream::operator<<(in_stack_fffffffffffffcc0,std::endl<char,std::char_traits<char>>);
    std::vector<int,_std::allocator<int>_>::size(local_170);
    in_stack_fffffffffffffcbc =
         NussinovAlgorithm::nussinov
                   (in_stack_fffffffffffffcf8,(int)((ulong)poVar2 >> 0x20),(int)poVar2);
    in_stack_fffffffffffffcb0 = (allocator_type *)(double)in_stack_fffffffffffffcbc;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_78,(long)local_d0);
    *pvVar6 = (value_type)in_stack_fffffffffffffcb0;
    if (((double)psVar9 == 0.0) && (!NAN((double)psVar9))) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_78,(long)local_d0);
      *pvVar6 = 0.0;
    }
    in_stack_fffffffffffffca8 = local_e0;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&local_a0,(long)local_d0);
    *pvVar6 = (value_type)in_stack_fffffffffffffca8;
    local_d0 = local_d0 + 1;
    psVar9 = (string *)(local_10 + (double)psVar9);
    NussinovAlgorithm::~NussinovAlgorithm(in_stack_fffffffffffffca0);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcb0);
  }
  std::make_pair<char_const(&)[7],std::vector<double,std::allocator<double>>&>
            ((char (*) [7])in_stack_fffffffffffffca8,
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::operator[](&local_c8,0);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>
              *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  std::pair<const_char_*,_std::vector<double,_std::allocator<double>_>_>::~pair
            ((pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)0x13bdd7);
  std::make_pair<char_const(&)[2],std::vector<double,std::allocator<double>>&>
            ((char (*) [2])in_stack_fffffffffffffca8,
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::operator[](&local_c8,1);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>
              *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  std::pair<const_char_*,_std::vector<double,_std::allocator<double>_>_>::~pair
            ((pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)0x13be26);
  std::make_pair<char_const(&)[4],std::vector<double,std::allocator<double>>&>
            ((char (*) [4])in_stack_fffffffffffffca8,
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffca0);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::operator[](&local_c8,2);
  std::pair<std::__cxx11::string,std::vector<double,std::allocator<double>>>::operator=
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>
              *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  std::pair<const_char_*,_std::vector<double,_std::allocator<double>_>_>::~pair
            ((pair<const_char_*,_std::vector<double,_std::allocator<double>_>_> *)0x13be75);
  std::__cxx11::string::string(local_250,in_RDX);
  write_csv(psVar9,in_stack_fffffffffffffec8);
  std::__cxx11::string::~string(local_250);
  poVar2 = std::operator<<((ostream *)&std::cout,"swipe done");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_128);
  std::
  tuple<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~tuple((tuple<double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)0x13bef7);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<double,_std::allocator<double>_>_>_>_>
             *)in_stack_fffffffffffffcb0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffcb0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffcb0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffcb0);
  return;
}

Assistant:

void Nussinov::lambda_swipe(double incr, ostream &fout, string outfile) {
    int size = ceil(1/incr + 1);
    cout << "size: " << size << endl;
    vector<double> lambda_buffer(size, 0);
    vector<double> F_buffer(size, 0);
    vector<double> CAI_buffer(size, 0);
    vector<pair<string, vector<double>>> dataset(3);
    int index = 0;
    double O;
    double CAI = 0;
    tuple<double, string> temp;

    string rna;
    double lambda = 0;
    while (lambda < 1.001) {
        fout << "lambda: " << lambda << endl;
        temp = nussinov_CAI(lambda, fout);
        O = get<0>(temp);
        rna = get<1>(temp);
        vector<int> rna_n(rna.size());
        transform2num(rna_n, rna);
        CAI = getCAI_s(rna_n, protein);
        if (lambda == 1) CAI = 0;
        lambda_buffer[index] = lambda;
        NussinovAlgorithm F = NussinovAlgorithm(rna_n, rna_n.size(), g);
        cout << lambda << " " << O << " " << CAI << " " << F.nussinov(0, rna_n.size()-1) << " " << lambda*(F.nussinov(0, rna_n.size()-1))+(1-lambda)*CAI << endl;
        F_buffer[index] = F.nussinov(0, rna_n.size()-1);
        if (lambda == 0) F_buffer[index] = 0;
        CAI_buffer[index] = CAI;
        index++;
        lambda += incr;
    }
    dataset[0] = make_pair("lambda", lambda_buffer);
    dataset[1] = make_pair("F", F_buffer);
    dataset[2] = make_pair("CAI", CAI_buffer);
    write_csv(outfile, dataset);
    cout << "swipe done" << endl;
}